

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O3

void __thiscall
Assimp::XGLImporter::InternReadFile
          (XGLImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_> *this_00;
  size_type __new_size;
  pointer pcVar1;
  aiScene *paVar2;
  aiNode *paVar3;
  aiNode *paVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  StreamReader<false,_false> *pSVar7;
  MemoryIOStream *__p;
  IrrXMLReader *__p_00;
  undefined4 extraout_var_00;
  aiMesh **__s;
  aiMaterial **__s_00;
  aiLight **ppaVar8;
  runtime_error *this_01;
  long *plVar9;
  size_type *psVar10;
  ulong uVar11;
  size_type sVar12;
  uint uVar13;
  shared_ptr<Assimp::IOStream> stream;
  vector<unsigned_char,_std::allocator<unsigned_char>_> uncompressed;
  CIrrXML_IOStreamReader st;
  TempScope scope;
  __shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> local_518;
  string local_508;
  shared_ptr<Assimp::IOStream> local_4e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4d8;
  StreamReader<false,_false> *local_4c0;
  XGLImporter *local_4b8;
  StreamReader<false,_false> *local_4b0;
  undefined1 local_4a8 [32];
  int local_488;
  undefined8 uStack_468;
  undefined4 uStack_460;
  undefined4 local_45c;
  undefined4 uStack_458;
  undefined8 uStack_454;
  undefined1 local_438 [32];
  _Base_ptr local_418;
  size_t local_410;
  _Rb_tree_node_base local_400;
  size_t local_3e0;
  pointer ppaStack_3d8;
  pointer local_3d0;
  pointer ppaStack_3c8;
  pointer local_3c0;
  pointer ppaStack_3b8;
  pointer local_3b0;
  aiNode *paStack_3a8;
  
  local_4d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uint8_t *)0x0;
  local_4d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_scene = pScene;
  pcVar1 = local_438 + 0x10;
  local_438._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"rb","");
  iVar5 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_438._0_8_);
  local_518._M_ptr = (element_type *)CONCAT44(extraout_var,iVar5);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IOStream*>
            (&local_518._M_refcount,local_518._M_ptr);
  if ((pointer)local_438._0_8_ != pcVar1) {
    operator_delete((void *)local_438._0_8_);
  }
  if (local_518._M_ptr == (IOStream *)0x0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8,
                   "Failed to open XGL/ZGL file ",pFile);
    plVar9 = (long *)std::__cxx11::string::append(local_4a8);
    local_438._0_8_ = *plVar9;
    psVar10 = (size_type *)(plVar9 + 2);
    if ((size_type *)local_438._0_8_ == psVar10) {
      local_438._16_8_ = *psVar10;
      local_438._24_8_ = plVar9[3];
      local_438._0_8_ = pcVar1;
    }
    else {
      local_438._16_8_ = *psVar10;
    }
    local_438._8_8_ = plVar9[1];
    *plVar9 = (long)psVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::runtime_error::runtime_error(this_01,(string *)local_438);
    *(undefined ***)this_01 = &PTR__runtime_error_00875f28;
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  BaseImporter::GetExtension((string *)local_438,pFile);
  iVar5 = std::__cxx11::string::compare(local_438);
  if ((pointer)local_438._0_8_ != pcVar1) {
    operator_delete((void *)local_438._0_8_);
  }
  if (iVar5 == 0) {
    pSVar7 = (StreamReader<false,_false> *)operator_new(0x38);
    local_4e8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_518._M_ptr;
    local_4e8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_518._M_refcount._M_pi;
    if (local_518._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_518._M_refcount._M_pi)->_M_use_count =
             (local_518._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_518._M_refcount._M_pi)->_M_use_count =
             (local_518._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    StreamReader<false,_false>::StreamReader(pSVar7,&local_4e8,false);
    local_4b0 = pSVar7;
    if (local_4e8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_4e8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    uStack_458 = 0;
    uStack_454 = 0;
    uStack_468 = 0;
    uStack_460 = 0;
    local_45c = 0;
    local_4b8 = this;
    inflateInit2_(local_4a8,0xfffffff1,"1.2.11",0x70);
    StreamReader<false,_false>::IncPtr(pSVar7,2);
    local_4a8._0_8_ = pSVar7->current;
    local_4a8._8_4_ = *(int *)&pSVar7->end - (int)local_4a8._0_8_;
    sVar12 = 0;
    local_4c0 = pSVar7;
    do {
      local_488 = 0x400;
      local_4a8._24_8_ = local_438;
      uVar6 = inflate(local_4a8,0);
      if (1 < uVar6) {
        local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_508,
                   "Failure decompressing this file using gzip, seemingly it is NOT a compressed .XGL file"
                   ,"");
        LogFunctions<Assimp::XGLImporter>::ThrowException(&local_508);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p != &local_508.field_2) {
          operator_delete(local_508._M_dataplus._M_p);
        }
      }
      uVar13 = 0x400 - local_488;
      __new_size = uVar13 + sVar12;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_4d8,__new_size);
      memcpy(local_4d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + sVar12,local_438,(ulong)uVar13);
      sVar12 = __new_size;
    } while (uVar6 != 1);
    inflateEnd(local_4a8);
    __p = (MemoryIOStream *)Intern::AllocateFromAssimpHeap::operator_new(0x28);
    (__p->super_IOStream)._vptr_IOStream = (_func_int **)&PTR__MemoryIOStream_00875cd0;
    __p->buffer = local_4d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    __p->length = __new_size;
    __p->pos = 0;
    __p->own = false;
    std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::reset<Assimp::MemoryIOStream>
              (&local_518,__p);
    pSVar7 = local_4c0;
    StreamReader<false,_false>::~StreamReader(local_4c0);
    operator_delete(pSVar7);
    this = local_4b8;
  }
  CIrrXML_IOStreamReader::CIrrXML_IOStreamReader
            ((CIrrXML_IOStreamReader *)local_4a8,local_518._M_ptr);
  __p_00 = irr::io::createIrrXMLReader((IFileReadCallBack *)local_4a8);
  this_00 = &this->m_reader;
  std::__shared_ptr<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>,(__gnu_cxx::_Lock_policy)2>::
  reset<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>>
            ((__shared_ptr<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>,(__gnu_cxx::_Lock_policy)2>
              *)this_00,__p_00);
  local_438._24_8_ = local_438 + 8;
  local_438._8_8_ = (ulong)(uint)local_438._12_4_ << 0x20;
  local_438._16_8_ = 0;
  local_410 = 0;
  local_400._M_left = &local_400;
  local_400._M_color = _S_red;
  local_400._M_parent = (_Base_ptr)0x0;
  local_3e0 = 0;
  ppaStack_3d8 = (pointer)0x0;
  local_3d0 = (pointer)0x0;
  ppaStack_3c8 = (pointer)0x0;
  local_3c0 = (pointer)0x0;
  ppaStack_3b8 = (pointer)0x0;
  local_3b0 = (pointer)0x0;
  paStack_3a8 = (aiNode *)0x0;
  local_418 = (_Base_ptr)local_438._24_8_;
  local_400._M_right = local_400._M_left;
  while( true ) {
    do {
      iVar5 = (*((this_00->
                 super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->_vptr_IIrrXMLReader[2])();
      if ((char)iVar5 == '\0') {
        if ((local_3d0 == ppaStack_3d8) || (ppaStack_3b8 == local_3c0)) {
          local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_508,"failed to extract data from XGL file, no meshes loaded",
                     "");
          LogFunctions<Assimp::XGLImporter>::ThrowException(&local_508);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_508._M_dataplus._M_p != &local_508.field_2) {
            operator_delete(local_508._M_dataplus._M_p);
          }
        }
        this->m_scene->mNumMeshes = (uint)((ulong)((long)local_3d0 - (long)ppaStack_3d8) >> 3);
        paVar2 = this->m_scene;
        uVar11 = (ulong)paVar2->mNumMeshes << 3;
        __s = (aiMesh **)operator_new__(uVar11);
        memset(__s,0,uVar11);
        paVar2->mMeshes = __s;
        if ((long)local_3d0 - (long)ppaStack_3d8 != 0) {
          memmove(this->m_scene->mMeshes,ppaStack_3d8,(long)local_3d0 - (long)ppaStack_3d8);
        }
        this->m_scene->mNumMaterials = (uint)((ulong)((long)ppaStack_3b8 - (long)local_3c0) >> 3);
        paVar2 = this->m_scene;
        uVar11 = (ulong)paVar2->mNumMaterials << 3;
        __s_00 = (aiMaterial **)operator_new__(uVar11);
        memset(__s_00,0,uVar11);
        paVar2->mMaterials = __s_00;
        if ((long)ppaStack_3b8 - (long)local_3c0 != 0) {
          memmove(this->m_scene->mMaterials,local_3c0,(long)ppaStack_3b8 - (long)local_3c0);
        }
        if (paStack_3a8 != (aiNode *)0x0) {
          this->m_scene->mNumLights = 1;
          ppaVar8 = (aiLight **)operator_new__(8);
          paVar4 = paStack_3a8;
          this->m_scene->mLights = ppaVar8;
          *this->m_scene->mLights = (aiLight *)paStack_3a8;
          paVar3 = this->m_scene->mRootNode;
          if (paStack_3a8 != paVar3) {
            uVar6 = (paVar3->mName).length;
            (paStack_3a8->mName).length = uVar6;
            memcpy((paStack_3a8->mName).data,(paVar3->mName).data,(ulong)uVar6);
            (paVar4->mName).data[uVar6] = '\0';
          }
        }
        TempScope::dismiss((TempScope *)local_438);
        TempScope::~TempScope((TempScope *)local_438);
        local_4a8._0_8_ = &PTR__CIrrXML_IOStreamReader_00876da8;
        if ((pointer)local_4a8._16_8_ != (pointer)0x0) {
          operator_delete((void *)local_4a8._16_8_);
        }
        if (local_518._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_518._M_refcount._M_pi)
          ;
        }
        if (local_4d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uint8_t *)0x0) {
          operator_delete(local_4d8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        return;
      }
      iVar5 = (*((this_00->
                 super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->_vptr_IIrrXMLReader[3])();
    } while (iVar5 != 1);
    iVar5 = (*((this_00->
               super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->_vptr_IIrrXMLReader[0xd])();
    if ((char *)CONCAT44(extraout_var_00,iVar5) == (char *)0x0) break;
    iVar5 = strcasecmp((char *)CONCAT44(extraout_var_00,iVar5),"world");
    if (iVar5 == 0) {
      ReadWorld(this,(TempScope *)local_438);
    }
  }
  __assert_fail("__null != s1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/StringComparison.h"
                ,0x8a,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
}

Assistant:

void XGLImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
#ifndef ASSIMP_BUILD_NO_COMPRESSED_XGL
    std::vector<Bytef> uncompressed;
#endif

    m_scene = pScene;
    std::shared_ptr<IOStream> stream( pIOHandler->Open( pFile, "rb"));

    // check whether we can read from the file
    if( stream.get() == NULL) {
        throw DeadlyImportError( "Failed to open XGL/ZGL file " + pFile + "");
    }

    // see if its compressed, if so uncompress it
    if (GetExtension(pFile) == "zgl") {
#ifdef ASSIMP_BUILD_NO_COMPRESSED_XGL
        ThrowException("Cannot read ZGL file since Assimp was built without compression support");
#else
        std::unique_ptr<StreamReaderLE> raw_reader(new StreamReaderLE(stream));

        // build a zlib stream
        z_stream zstream;
        zstream.opaque = Z_NULL;
        zstream.zalloc = Z_NULL;
        zstream.zfree  = Z_NULL;
        zstream.data_type = Z_BINARY;

        // raw decompression without a zlib or gzip header
        inflateInit2(&zstream, -MAX_WBITS);

        // skip two extra bytes, zgl files do carry a crc16 upfront (I think)
        raw_reader->IncPtr(2);

        zstream.next_in   = reinterpret_cast<Bytef*>( raw_reader->GetPtr() );
        zstream.avail_in  = raw_reader->GetRemainingSize();

        size_t total = 0l;

        // TODO: be smarter about this, decompress directly into heap buffer
        // and decompress the data .... do 1k chunks in the hope that we won't kill the stack
    #define MYBLOCK 1024
        Bytef block[MYBLOCK];
        int ret;
        do {
            zstream.avail_out = MYBLOCK;
            zstream.next_out = block;
            ret = inflate(&zstream, Z_NO_FLUSH);

            if (ret != Z_STREAM_END && ret != Z_OK) {
                ThrowException("Failure decompressing this file using gzip, seemingly it is NOT a compressed .XGL file");
            }
            const size_t have = MYBLOCK - zstream.avail_out;
            total += have;
            uncompressed.resize(total);
            memcpy(uncompressed.data() + total - have,block,have);
        }
        while (ret != Z_STREAM_END);

        // terminate zlib
        inflateEnd(&zstream);

        // replace the input stream with a memory stream
        stream.reset(new MemoryIOStream(reinterpret_cast<uint8_t*>(uncompressed.data()),total));
#endif
    }

    // construct the irrXML parser
    CIrrXML_IOStreamReader st(stream.get());
    m_reader.reset( createIrrXMLReader( ( IFileReadCallBack* ) &st ) );

    // parse the XML file
    TempScope scope;

    while (ReadElement())   {
        if (!ASSIMP_stricmp(m_reader->getNodeName(),"world")) {
            ReadWorld(scope);
        }
    }


    std::vector<aiMesh*>& meshes = scope.meshes_linear;
    std::vector<aiMaterial*>& materials = scope.materials_linear;
    if(!meshes.size() || !materials.size()) {
        ThrowException("failed to extract data from XGL file, no meshes loaded");
    }

    // copy meshes
    m_scene->mNumMeshes = static_cast<unsigned int>(meshes.size());
    m_scene->mMeshes = new aiMesh*[m_scene->mNumMeshes]();
    std::copy(meshes.begin(),meshes.end(),m_scene->mMeshes);

    // copy materials
    m_scene->mNumMaterials = static_cast<unsigned int>(materials.size());
    m_scene->mMaterials = new aiMaterial*[m_scene->mNumMaterials]();
    std::copy(materials.begin(),materials.end(),m_scene->mMaterials);

    if (scope.light) {
        m_scene->mNumLights = 1;
        m_scene->mLights = new aiLight*[1];
        m_scene->mLights[0] = scope.light;

        scope.light->mName = m_scene->mRootNode->mName;
    }

    scope.dismiss();
}